

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

SVInt __thiscall slang::SVInt::sext(SVInt *this,bitwidth_t bits)

{
  uint uVar1;
  uint uVar2;
  uint64_t *puVar3;
  long lVar4;
  uint in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  ulong __n;
  uint uVar6;
  undefined4 in_register_00000034;
  long *plVar7;
  long *__src;
  uint64_t uVar8;
  byte bVar9;
  size_t __n_00;
  uint uVar10;
  SVInt SVar11;
  
  plVar7 = (long *)CONCAT44(in_register_00000034,bits);
  uVar2 = *(uint *)(plVar7 + 1);
  if (uVar2 <= in_EDX && in_EDX - uVar2 != 0) {
    if (in_EDX < 0x41 && (*(byte *)((long)plVar7 + 0xd) & 1) == 0) {
      SVInt(this,in_EDX,
            (ulong)((*plVar7 << (-(char)uVar2 & 0x3fU)) >> ((byte)(in_EDX - uVar2) & 0x3f)) >>
            (-(char)in_EDX & 0x3fU),*(bool *)((long)plVar7 + 0xc));
      uVar5 = extraout_RDX_00;
    }
    else {
      allocUninitialized(this,in_EDX,*(bool *)((long)plVar7 + 0xc),
                         (bool)(in_EDX < 0x41 | *(byte *)((long)plVar7 + 0xd) & 1));
      uVar2 = *(uint *)(plVar7 + 1) + 0x3f;
      uVar10 = uVar2 >> 6;
      uVar6 = in_EDX + 0x3f >> 6;
      puVar3 = (this->super_SVIntStorage).field_0.pVal;
      __src = plVar7;
      if ((*(byte *)((long)plVar7 + 0xd) & 1) != 0) {
        __src = (long *)*plVar7;
      }
      if (0x40 < *(uint *)(plVar7 + 1)) {
        __src = (long *)*plVar7;
      }
      __n = (ulong)(uVar10 * 8);
      memcpy(puVar3,__src,__n);
      uVar1 = uVar10 - 1;
      bVar9 = ~(byte)uVar2;
      uVar8 = (long)(puVar3[uVar1] << (bVar9 & 0x3f)) >> (bVar9 & 0x3f);
      puVar3[uVar1] = uVar8;
      __n_00 = (ulong)(uVar6 - uVar10) << 3;
      memset((void *)((long)puVar3 + __n),(int)((long)uVar8 >> 0x3f),__n_00);
      if (*(char *)((long)plVar7 + 0xd) == '\x01') {
        puVar3 = puVar3 + uVar6;
        lVar4 = plVar7[1];
        memcpy(puVar3,(void *)(*plVar7 + (ulong)(uVar10 << 3)),__n);
        uVar8 = (long)(puVar3[uVar1] << (-(char)lVar4 & 0x3fU)) >> (-(char)lVar4 & 0x3fU);
        puVar3[uVar1] = uVar8;
        memset((void *)((long)puVar3 + (ulong)(uVar10 << 3)),(int)((long)uVar8 >> 0x3f),__n_00);
      }
      clearUnusedBits(this);
      uVar5 = extraout_RDX;
    }
    SVar11.super_SVIntStorage.bitWidth = (int)uVar5;
    SVar11.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar5 >> 0x20);
    SVar11.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar5 >> 0x28);
    SVar11.super_SVIntStorage._14_2_ = (short)((ulong)uVar5 >> 0x30);
    SVar11.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
    return (SVInt)SVar11.super_SVIntStorage;
  }
  assert::assertFailed
            ("bits > bitWidth",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/numeric/SVInt.cpp"
             ,0x602,"SVInt slang::SVInt::sext(bitwidth_t) const");
}

Assistant:

SVInt SVInt::sext(bitwidth_t bits) const {
    ASSERT(bits > bitWidth);

    if (bits <= SVInt::BITS_PER_WORD && !unknownFlag) {
        uint64_t newVal = val << (SVInt::BITS_PER_WORD - bitWidth); // NOLINT
        newVal = uint64_t((int64_t)newVal >> (bits - bitWidth));
        return SVInt(bits, newVal >> (SVInt::BITS_PER_WORD - bits), signFlag);
    }

    // copy and sign extend; for unknown values, this copies the data words
    // but not the unknown-indicator words, which we do separately below
    SVInt result = SVInt::allocUninitialized(bits, signFlag, unknownFlag);
    uint32_t oldWords = SVInt::getNumWords(bitWidth, false);
    uint32_t newWords = SVInt::getNumWords(bits, false);
    signExtendCopy(result.pVal, getRawData(), bitWidth, oldWords, newWords);

    if (unknownFlag)
        signExtendCopy(result.pVal + newWords, pVal + oldWords, bitWidth, oldWords, newWords);

    result.clearUnusedBits();
    return result;
}